

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pshuflw_xmm_x86_64(ZMMReg *d,ZMMReg *s,int order)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint64_t uVar4;
  
  uVar1 = *(uint16_t *)((long)s + (ulong)((uint)order >> 1 & 6));
  uVar2 = *(uint16_t *)((long)s + (ulong)((uint)order >> 3 & 6));
  uVar3 = *(uint16_t *)((long)s + (ulong)((uint)order >> 5 & 6));
  uVar4 = s->_q_ZMMReg[1];
  d->_w_ZMMReg[0] = s->_w_ZMMReg[order & 3];
  d->_w_ZMMReg[1] = uVar1;
  d->_w_ZMMReg[2] = uVar2;
  d->_w_ZMMReg[3] = uVar3;
  d->_q_ZMMReg[1] = uVar4;
  return;
}

Assistant:

void glue(helper_pshuflw, SUFFIX)(Reg *d, Reg *s, int order)
{
    Reg r;

    r.W(0) = s->W(order & 3);
    r.W(1) = s->W((order >> 2) & 3);
    r.W(2) = s->W((order >> 4) & 3);
    r.W(3) = s->W((order >> 6) & 3);
    r.Q(1) = s->Q(1);
    *d = r;
}